

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_io.c
# Opt level: O0

int kvtree_file_is_readable(char *file)

{
  int iVar1;
  char *file_local;
  
  iVar1 = access(file,4);
  file_local._4_4_ = (uint)(iVar1 < 0);
  return file_local._4_4_;
}

Assistant:

int kvtree_file_is_readable(const char* file)
{
  /* check whether the file can be read */
  if (access(file, R_OK) < 0) {
    /* TODO: would be nice to print a message here, but
     *       functions calling this expect it to be quiet
    kvtree_dbg(2, "File not readable: %s errno=%d %s @ %s:%d",
      file, errno, strerror(errno), __FILE__, __LINE__
    );
    */
    return KVTREE_FAILURE;
  }
  return KVTREE_SUCCESS;
}